

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O3

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::makeI32x4Const
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,array<unsigned_int,_4UL> *vals)

{
  Result<wasm::Ok> *pRVar1;
  size_t i;
  long lVar2;
  Literal *this_00;
  undefined1 auStack_f8 [8];
  array<wasm::Literal,_4UL> lanes;
  anon_union_16_6_1532cd5a_for_Literal_0 local_70;
  undefined8 local_60;
  Literal local_58;
  Result<wasm::Ok> *local_40;
  Index local_34;
  
  this_00 = (Literal *)auStack_f8;
  lanes._M_elems[3].field_0.i64 = 0;
  lanes._M_elems[3].field_0.func.super_IString.str._M_str = (char *)0x0;
  lanes._M_elems[2].field_0.func.super_IString.str._M_str = (char *)0x0;
  lanes._M_elems[2].type.id = 0;
  lanes._M_elems[1].type.id = 0;
  lanes._M_elems[2].field_0.i64 = 0;
  lanes._M_elems[1].field_0.i64 = 0;
  lanes._M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
  lanes._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
  lanes._M_elems[0].type.id = 0;
  auStack_f8 = (undefined1  [8])0x0;
  lanes._M_elems[0].field_0.i64 = 0;
  lVar2 = 0;
  local_40 = __return_storage_ptr__;
  local_34 = pos;
  do {
    local_70.i32 = vals->_M_elems[lVar2];
    local_60 = 2;
    Literal::operator=(this_00,(Literal *)&local_70.func);
    Literal::~Literal((Literal *)&local_70.func);
    lVar2 = lVar2 + 1;
    this_00 = this_00 + 1;
  } while (lVar2 != 4);
  Literal::Literal(&local_58,(LaneArray<4> *)auStack_f8);
  IRBuilder::makeConst((Result<wasm::Ok> *)&lanes._M_elems[3].type,&this->irBuilder,&local_58);
  pRVar1 = local_40;
  withLoc<wasm::Ok>(local_40,this,local_34,(Result<wasm::Ok> *)&lanes._M_elems[3].type);
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)&lanes._M_elems[3].type);
  Literal::~Literal(&local_58);
  lVar2 = 0x48;
  do {
    Literal::~Literal((Literal *)((long)lanes._M_elems + lVar2 + -8));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  return pRVar1;
}

Assistant:

Result<> makeI32x4Const(Index pos,
                          const std::vector<Annotation>& annotations,
                          const std::array<uint32_t, 4>& vals) {
    std::array<Literal, 4> lanes;
    for (size_t i = 0; i < 4; ++i) {
      lanes[i] = Literal(vals[i]);
    }
    return withLoc(pos, irBuilder.makeConst(Literal(lanes)));
  }